

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t * archive_acl_text_w(archive *a,archive_acl *acl,wchar_t flags)

{
  size_t sVar1;
  int *piVar2;
  wchar_t *local_60;
  wchar_t *wp;
  wchar_t r;
  wchar_t id;
  archive_acl_entry *ap;
  int *piStack_40;
  wchar_t separator;
  wchar_t *prefix;
  wchar_t *wname;
  size_t length;
  wchar_t count;
  wchar_t flags_local;
  archive_acl *acl_local;
  archive *a_local;
  
  length._4_4_ = flags;
  _count = acl;
  acl_local = (archive_acl *)a;
  if (acl->acl_text_w != (wchar_t *)0x0) {
    free(acl->acl_text_w);
    _count->acl_text_w = (wchar_t *)0x0;
  }
  ap._4_4_ = L',';
  length._0_4_ = 0;
  wname = (wchar_t *)0x0;
  _r = _count->acl_head;
  do {
    if (_r == (archive_acl_entry *)0x0) {
      if ((0 < (int)length) && ((length._4_4_ & 0x100U) != 0)) {
        wname = wname + 8;
      }
      if ((int)length == 0) {
        a_local = (archive *)0x0;
      }
      else {
        local_60 = (wchar_t *)malloc((long)wname << 2);
        _count->acl_text_w = local_60;
        if (local_60 == (wchar_t *)0x0) {
          a_local = (archive *)0x0;
        }
        else {
          length._0_4_ = 0;
          if ((length._4_4_ & 0x100U) != 0) {
            append_entry_w(&local_60,(wchar_t *)0x0,L'✒',(wchar_t *)0x0,_count->mode & 0x1c0,
                           L'\xffffffff');
            *local_60 = L',';
            local_60 = local_60 + 1;
            append_entry_w(&local_60,(wchar_t *)0x0,L'✔',(wchar_t *)0x0,_count->mode & 0x38,
                           L'\xffffffff');
            *local_60 = L',';
            local_60 = local_60 + 1;
            append_entry_w(&local_60,(wchar_t *)0x0,L'✖',(wchar_t *)0x0,_count->mode & 7,
                           L'\xffffffff');
            length._0_4_ = (int)length + 3;
            for (_r = _count->acl_head; _r != (archive_acl_entry *)0x0; _r = _r->next) {
              if ((_r->type & 0x100U) != 0) {
                wp._0_4_ = archive_mstring_get_wcs((archive *)acl_local,&_r->name,&prefix);
                if ((wchar_t)wp == L'\0') {
                  *local_60 = ap._4_4_;
                  if ((length._4_4_ & 0x400U) == 0) {
                    wp._4_4_ = L'\xffffffff';
                  }
                  else {
                    wp._4_4_ = _r->id;
                  }
                  local_60 = local_60 + 1;
                  append_entry_w(&local_60,(wchar_t *)0x0,_r->tag,prefix,_r->permset,wp._4_4_);
                  length._0_4_ = (int)length + 1;
                }
                else if (((wchar_t)wp < L'\0') && (piVar2 = __errno_location(), *piVar2 == 0xc)) {
                  return (wchar_t *)0x0;
                }
              }
            }
          }
          if ((length._4_4_ & 0x200U) != 0) {
            if ((length._4_4_ & 0x800U) == 0) {
              piStack_40 = (wchar_t *)0x0;
            }
            else {
              piStack_40 = anon_var_dwarf_a97b6;
            }
            _r = _count->acl_head;
            length._0_4_ = 0;
            for (; _r != (archive_acl_entry *)0x0; _r = _r->next) {
              if ((_r->type & 0x200U) != 0) {
                wp._0_4_ = archive_mstring_get_wcs((archive *)acl_local,&_r->name,&prefix);
                if ((wchar_t)wp == L'\0') {
                  if (0 < (int)length) {
                    *local_60 = ap._4_4_;
                    local_60 = local_60 + 1;
                  }
                  if ((length._4_4_ & 0x400U) == 0) {
                    wp._4_4_ = L'\xffffffff';
                  }
                  else {
                    wp._4_4_ = _r->id;
                  }
                  append_entry_w(&local_60,piStack_40,_r->tag,prefix,_r->permset,wp._4_4_);
                  length._0_4_ = (int)length + 1;
                }
                else if (((wchar_t)wp < L'\0') && (piVar2 = __errno_location(), *piVar2 == 0xc)) {
                  return (wchar_t *)0x0;
                }
              }
            }
          }
          a_local = (archive *)_count->acl_text_w;
        }
      }
      return (wchar_t *)a_local;
    }
    if ((_r->type & length._4_4_) != 0) {
      length._0_4_ = (int)length + 1;
      if (((length._4_4_ & 0x800U) != 0) && ((_r->type & 0x200U) != 0)) {
        wname = wname + 2;
      }
      wname = (wchar_t *)((long)wname + 6);
      wp._0_4_ = archive_mstring_get_wcs((archive *)acl_local,&_r->name,&prefix);
      if (((wchar_t)wp == L'\0') && (prefix != (wchar_t *)0x0)) {
        sVar1 = wcslen(prefix);
        wname = (wchar_t *)(sVar1 + (long)wname);
      }
      else {
        if (((wchar_t)wp < L'\0') && (piVar2 = __errno_location(), *piVar2 == 0xc)) {
          return (wchar_t *)0x0;
        }
        wname = (wchar_t *)((long)wname + 0xd);
      }
      wname = (wchar_t *)((long)wname + 0x13);
    }
    _r = _r->next;
  } while( true );
}

Assistant:

const wchar_t *
archive_acl_text_w(struct archive *a, struct archive_acl *acl, int flags)
{
	int count;
	size_t length;
	const wchar_t *wname;
	const wchar_t *prefix;
	wchar_t separator;
	struct archive_acl_entry *ap;
	int id, r;
	wchar_t *wp;

	if (acl->acl_text_w != NULL) {
		free (acl->acl_text_w);
		acl->acl_text_w = NULL;
	}

	separator = L',';
	count = 0;
	length = 0;
	ap = acl->acl_head;
	while (ap != NULL) {
		if ((ap->type & flags) != 0) {
			count++;
			if ((flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT) &&
			    (ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT))
				length += 8; /* "default:" */
			length += 5; /* tag name */
			length += 1; /* colon */
			r = archive_mstring_get_wcs(a, &ap->name, &wname);
			if (r == 0 && wname != NULL)
				length += wcslen(wname);
			else if (r < 0 && errno == ENOMEM)
				return (NULL);
			else
				length += sizeof(uid_t) * 3 + 1;
			length ++; /* colon */
			length += 3; /* rwx */
			length += 1; /* colon */
			length += max(sizeof(uid_t), sizeof(gid_t)) * 3 + 1;
			length ++; /* newline */
		}
		ap = ap->next;
	}

	if (count > 0 && ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0)) {
		length += 10; /* "user::rwx\n" */
		length += 11; /* "group::rwx\n" */
		length += 11; /* "other::rwx\n" */
	}

	if (count == 0)
		return (NULL);

	/* Now, allocate the string and actually populate it. */
	wp = acl->acl_text_w = (wchar_t *)malloc(length * sizeof(wchar_t));
	if (wp == NULL)
		return (NULL);
	count = 0;
	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_USER_OBJ, NULL,
		    acl->mode & 0700, -1);
		*wp++ = ',';
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_GROUP_OBJ, NULL,
		    acl->mode & 0070, -1);
		*wp++ = ',';
		append_entry_w(&wp, NULL, ARCHIVE_ENTRY_ACL_OTHER, NULL,
		    acl->mode & 0007, -1);
		count += 3;

		ap = acl->acl_head;
		while (ap != NULL) {
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
				r = archive_mstring_get_wcs(a, &ap->name, &wname);
				if (r == 0) {
					*wp++ = separator;
					if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
						id = ap->id;
					else
						id = -1;
					append_entry_w(&wp, NULL, ap->tag, wname,
					    ap->permset, id);
					count++;
				} else if (r < 0 && errno == ENOMEM)
					return (NULL);
			}
			ap = ap->next;
		}
	}


	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0) {
		if (flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT)
			prefix = L"default:";
		else
			prefix = NULL;
		ap = acl->acl_head;
		count = 0;
		while (ap != NULL) {
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0) {
				r = archive_mstring_get_wcs(a, &ap->name, &wname);
				if (r == 0) {
					if (count > 0)
						*wp++ = separator;
					if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
						id = ap->id;
					else
						id = -1;
					append_entry_w(&wp, prefix, ap->tag,
					    wname, ap->permset, id);
					count ++;
				} else if (r < 0 && errno == ENOMEM)
					return (NULL);
			}
			ap = ap->next;
		}
	}

	return (acl->acl_text_w);
}